

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O3

expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* tinyusdz::prim::VisibilityEnumHandler
            (expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,string *tok)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  undefined4 *puVar4;
  ostream *poVar5;
  long *plVar6;
  ulong *puVar7;
  pointer pbVar8;
  size_type sVar9;
  long lVar10;
  ulong uVar11;
  ulong *puVar12;
  string s;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  toks;
  ostringstream oss;
  string local_2f0;
  undefined1 local_2d0 [24];
  long lStack_2b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b0;
  ulong local_2a0;
  long lStack_298;
  ulong *local_290;
  long local_288;
  ulong local_280;
  long lStack_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  ulong *local_250;
  long local_248;
  ulong local_240;
  long lStack_238;
  string *local_230;
  long *local_228 [2];
  long local_218 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e8;
  undefined2 *local_1c8;
  undefined8 local_1c0;
  undefined2 local_1b8;
  undefined6 uStack_1b6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  byte local_188;
  ios_base local_138 [264];
  
  puVar4 = (undefined4 *)operator_new(0x20);
  *puVar4 = 0;
  *(char **)(puVar4 + 2) = "inherited";
  puVar4[4] = 1;
  *(char **)(puVar4 + 6) = "invisible";
  local_228[0] = local_218;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"visibility","");
  lVar10 = 8;
  do {
    iVar3 = ::std::__cxx11::string::compare((char *)tok);
    if (iVar3 == 0) {
      local_188 = 1;
      local_1a8._M_dataplus._M_p._0_1_ = 1;
      goto LAB_001f4231;
    }
    lVar10 = lVar10 + 0x10;
  } while (lVar10 != 0x28);
  local_1e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  paVar1 = &local_1a8.field_2;
  lVar10 = 0;
  local_230 = tok;
  do {
    ::std::__cxx11::string::string
              ((string *)&local_1a8,*(char **)((long)puVar4 + lVar10 + 8),(allocator *)&local_270);
    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1e8,
               &local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
    }
    lVar10 = lVar10 + 0x10;
  } while (lVar10 != 0x20);
  local_288 = 2;
  local_280 = CONCAT53(local_280._3_5_,0x202c);
  local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
  local_2f0.field_2._M_allocated_capacity._0_2_ = 0x22;
  local_2f0._M_string_length = 1;
  local_290 = &local_280;
  quote((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)local_2d0,&local_1e8,&local_2f0);
  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  if (local_2d0._0_8_ != local_2d0._8_8_) {
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,((_Alloc_hider *)local_2d0._0_8_)->_M_p,
               *(size_type *)(local_2d0._0_8_ + 8));
    local_2d0._0_8_ = local_2d0._0_8_ + 0x20;
    if (local_2d0._0_8_ != local_2d0._8_8_) {
      do {
        poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_1a8,(char *)local_290,local_288);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,(((pointer)local_2d0._0_8_)->_M_dataplus)._M_p,
                   ((pointer)local_2d0._0_8_)->_M_string_length);
        local_2d0._0_8_ = local_2d0._0_8_ + 0x20;
      } while (local_2d0._0_8_ != local_2d0._8_8_);
    }
  }
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  ::std::ios_base::~ios_base(local_138);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
  }
  if (local_290 != &local_280) {
    operator_delete(local_290,local_280 + 1);
  }
  ::std::operator+(&local_208,"Allowed tokens are [",&local_270);
  plVar6 = (long *)::std::__cxx11::string::append((char *)&local_208);
  tok = local_230;
  local_2b0._M_allocated_capacity = (size_type)&local_2a0;
  puVar7 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar7) {
    local_2a0 = *puVar7;
    lStack_298 = plVar6[3];
  }
  else {
    local_2a0 = *puVar7;
    local_2b0._M_allocated_capacity = (size_type)(ulong *)*plVar6;
  }
  local_2b0._8_8_ = plVar6[1];
  *plVar6 = (long)puVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_1b8 = 0x22;
  local_1c0 = 1;
  local_1a8.field_2._M_allocated_capacity._0_2_ = 0x22;
  local_1a8._M_string_length = 1;
  local_1c8 = &local_1b8;
  local_1a8._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_append((char *)&local_1a8,(ulong)(local_230->_M_dataplus)._M_p);
  plVar6 = (long *)::std::__cxx11::string::_M_append((char *)&local_1a8,(ulong)local_1c8);
  puVar7 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar7) {
    local_240 = *puVar7;
    lStack_238 = plVar6[3];
    local_250 = &local_240;
  }
  else {
    local_240 = *puVar7;
    local_250 = (ulong *)*plVar6;
  }
  local_248 = plVar6[1];
  *plVar6 = (long)puVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  uVar11 = 0xf;
  if ((ulong *)local_2b0._M_allocated_capacity != &local_2a0) {
    uVar11 = local_2a0;
  }
  if (uVar11 < (ulong)(local_248 + local_2b0._8_8_)) {
    uVar11 = 0xf;
    if (local_250 != &local_240) {
      uVar11 = local_240;
    }
    if (uVar11 < (ulong)(local_248 + local_2b0._8_8_)) goto LAB_001f3ff6;
    plVar6 = (long *)::std::__cxx11::string::replace
                               ((ulong)&local_250,0,(char *)0x0,local_2b0._M_allocated_capacity);
  }
  else {
LAB_001f3ff6:
    plVar6 = (long *)::std::__cxx11::string::_M_append(local_2b0._M_local_buf,(ulong)local_250);
  }
  local_2d0._0_8_ = local_2d0 + 0x10;
  pbVar8 = (pointer)(plVar6 + 2);
  if ((pointer)*plVar6 == pbVar8) {
    local_2d0._16_8_ = (pbVar8->_M_dataplus)._M_p;
    lStack_2b8 = plVar6[3];
  }
  else {
    local_2d0._16_8_ = (pbVar8->_M_dataplus)._M_p;
    local_2d0._0_8_ = (pointer)*plVar6;
  }
  local_2d0._8_8_ = plVar6[1];
  *plVar6 = (long)pbVar8;
  plVar6[1] = 0;
  *(undefined1 *)&(pbVar8->_M_dataplus)._M_p = 0;
  plVar6 = (long *)::std::__cxx11::string::append(local_2d0);
  local_1a8._M_dataplus._M_p = (pointer)*plVar6;
  puVar7 = (ulong *)(plVar6 + 2);
  if ((ulong *)local_1a8._M_dataplus._M_p == puVar7) {
    local_2f0.field_2._M_allocated_capacity = *puVar7;
    local_2f0.field_2._8_8_ = plVar6[3];
    local_1a8._M_string_length = plVar6[1];
    *plVar6 = (long)puVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
LAB_001f4109:
    local_280 = local_2f0.field_2._M_allocated_capacity;
    lStack_278 = local_2f0.field_2._8_8_;
    local_2f0.field_2._M_allocated_capacity =
         local_2f0.field_2._M_allocated_capacity & 0xffffffffffffff00;
LAB_001f4134:
    local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
    local_1a8.field_2._8_8_ = lStack_278;
  }
  else {
    local_280 = plVar6[2];
    local_1a8._M_string_length = plVar6[1];
    *plVar6 = (long)puVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    local_2f0.field_2._M_allocated_capacity = local_280;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p == &local_2f0.field_2) goto LAB_001f4109;
    local_2f0.field_2._M_allocated_capacity = local_280 & 0xffffffffffffff00;
    if ((ulong *)local_1a8._M_dataplus._M_p == &local_280) goto LAB_001f4134;
  }
  local_1a8.field_2._M_allocated_capacity = local_280;
  local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
  local_188 = 0;
  local_2f0._M_string_length = 0;
  local_288 = 0;
  local_280 = local_280 & 0xffffffffffffff00;
  local_290 = &local_280;
  if ((pointer)local_2d0._0_8_ != (pointer)(local_2d0 + 0x10)) {
    operator_delete((void *)local_2d0._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_2d0._16_8_)->_M_p + 1));
  }
  if (local_250 != &local_240) {
    operator_delete(local_250,local_240 + 1);
  }
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8,CONCAT62(uStack_1b6,local_1b8) + 1);
  }
  if ((ulong *)local_2b0._M_allocated_capacity != &local_2a0) {
    operator_delete((void *)local_2b0._M_allocated_capacity,local_2a0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,
                    CONCAT62(local_208.field_2._M_allocated_capacity._2_6_,
                             local_208.field_2._M_allocated_capacity._0_2_) + 1);
  }
  paVar1 = &local_270.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != paVar1) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1e8);
  if ((local_188 & 1) == 0) {
    local_270._M_dataplus._M_p = (pointer)paVar1;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_270,local_1a8._M_dataplus._M_p,
               local_1a8._M_dataplus._M_p + local_1a8._M_string_length);
    (__return_storage_ptr__->contained).
    super_storage_t_impl<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .m_has_value = false;
    puVar7 = (ulong *)((long)&(__return_storage_ptr__->contained).
                              super_storage_t_impl<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              .field_0 + 0x10);
    *(ulong **)
     &(__return_storage_ptr__->contained).
      super_storage_t_impl<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .field_0 = puVar7;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p == paVar1) {
      *puVar7 = local_270.field_2._M_allocated_capacity;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->contained).
               super_storage_t_impl<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .field_0 + 0x18) = local_270.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->contained).
      super_storage_t_impl<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .field_0.m_error._M_dataplus._M_p = local_270._M_dataplus._M_p;
      *(size_type *)
       ((long)&(__return_storage_ptr__->contained).
               super_storage_t_impl<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .field_0 + 0x10) = local_270.field_2._M_allocated_capacity;
    }
    (__return_storage_ptr__->contained).
    super_storage_t_impl<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .field_0.m_error._M_string_length = local_270._M_string_length;
    goto LAB_001f45ad;
  }
LAB_001f4231:
  lVar10 = 0;
  do {
    iVar3 = ::std::__cxx11::string::compare((char *)tok);
    if (iVar3 == 0) {
      (__return_storage_ptr__->contained).
      super_storage_t_impl<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .m_has_value = true;
      (__return_storage_ptr__->contained).
      super_storage_t_impl<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .field_0.m_value = *(value_type *)((long)puVar4 + lVar10);
      goto LAB_001f45ad;
    }
    lVar10 = lVar10 + 0x10;
  } while (lVar10 != 0x20);
  paVar1 = &local_208.field_2;
  local_208.field_2._M_allocated_capacity._0_2_ = 0x22;
  local_208._M_string_length = 1;
  paVar2 = &local_270.field_2;
  local_270._M_dataplus._M_p = (pointer)paVar2;
  local_208._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_270,paVar1,(undefined1 *)((long)&local_208.field_2 + 1));
  ::std::__cxx11::string::_M_append((char *)&local_270,(ulong)(tok->_M_dataplus)._M_p);
  plVar6 = (long *)::std::__cxx11::string::_M_append
                             ((char *)&local_270,(ulong)local_208._M_dataplus._M_p);
  puVar7 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar7) {
    local_2a0 = *puVar7;
    lStack_298 = plVar6[3];
    local_2b0._M_allocated_capacity = (size_type)&local_2a0;
  }
  else {
    local_2a0 = *puVar7;
    local_2b0._M_allocated_capacity = (size_type)(ulong *)*plVar6;
  }
  local_2b0._8_8_ = plVar6[1];
  *plVar6 = (long)puVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != paVar2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  plVar6 = (long *)::std::__cxx11::string::append(local_2b0._M_local_buf);
  pbVar8 = (pointer)(plVar6 + 2);
  if ((pointer)*plVar6 == pbVar8) {
    local_2d0._16_8_ = (pbVar8->_M_dataplus)._M_p;
    lStack_2b8 = plVar6[3];
    local_2d0._0_8_ = (pointer)(local_2d0 + 0x10);
  }
  else {
    local_2d0._16_8_ = (pbVar8->_M_dataplus)._M_p;
    local_2d0._0_8_ = (pointer)*plVar6;
  }
  local_2d0._8_8_ = plVar6[1];
  *plVar6 = (long)pbVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)::std::__cxx11::string::_M_append(local_2d0,(ulong)local_228[0]);
  puVar7 = (ulong *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar7) {
    local_2f0.field_2._M_allocated_capacity = *puVar7;
    local_2f0.field_2._8_8_ = plVar6[3];
    local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
  }
  else {
    local_2f0.field_2._M_allocated_capacity = *puVar7;
    local_2f0._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_2f0._M_string_length = plVar6[1];
  *plVar6 = (long)puVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)::std::__cxx11::string::append((char *)&local_2f0);
  local_290 = &local_280;
  puVar7 = (ulong *)*plVar6;
  puVar12 = (ulong *)(plVar6 + 2);
  if (puVar7 == puVar12) {
    local_280 = *puVar12;
    lStack_278 = plVar6[3];
    sVar9 = plVar6[1];
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
LAB_001f44d8:
    local_270.field_2._M_allocated_capacity = local_280;
    local_270.field_2._8_8_ = lStack_278;
    local_280 = local_280 & 0xffffffffffffff00;
    (__return_storage_ptr__->contained).
    super_storage_t_impl<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .m_has_value = false;
    (__return_storage_ptr__->contained).
    super_storage_t_impl<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .field_0.m_error._M_dataplus._M_p =
         (pointer)((long)&(__return_storage_ptr__->contained).
                          super_storage_t_impl<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          .field_0 + 0x10);
LAB_001f4500:
    *(size_type *)
     ((long)&(__return_storage_ptr__->contained).
             super_storage_t_impl<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .field_0 + 0x10) = local_270.field_2._M_allocated_capacity;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->contained).
             super_storage_t_impl<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .field_0 + 0x18) = local_270.field_2._8_8_;
  }
  else {
    local_270.field_2._M_allocated_capacity = plVar6[2];
    sVar9 = plVar6[1];
    *plVar6 = (long)puVar12;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    local_280 = local_270.field_2._M_allocated_capacity;
    if (puVar7 == local_290) goto LAB_001f44d8;
    local_280 = local_270.field_2._M_allocated_capacity & 0xffffffffffffff00;
    (__return_storage_ptr__->contained).
    super_storage_t_impl<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .m_has_value = false;
    (__return_storage_ptr__->contained).
    super_storage_t_impl<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .field_0.m_error._M_dataplus._M_p =
         (pointer)((long)&(__return_storage_ptr__->contained).
                          super_storage_t_impl<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          .field_0 + 0x10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar7 == paVar2) goto LAB_001f4500;
    (__return_storage_ptr__->contained).
    super_storage_t_impl<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .field_0.m_error._M_dataplus._M_p = (pointer)puVar7;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->contained).
             super_storage_t_impl<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .field_0 + 0x10) = local_270.field_2._M_allocated_capacity;
  }
  local_288 = 0;
  (__return_storage_ptr__->contained).
  super_storage_t_impl<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .field_0.m_error._M_string_length = sVar9;
  local_270._M_string_length = 0;
  local_270.field_2._M_allocated_capacity =
       local_270.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_270._M_dataplus._M_p = (pointer)paVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_2d0._0_8_ != (pointer)(local_2d0 + 0x10)) {
    operator_delete((void *)local_2d0._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_2d0._16_8_)->_M_p + 1));
  }
  if ((ulong *)local_2b0._M_allocated_capacity != &local_2a0) {
    operator_delete((void *)local_2b0._M_allocated_capacity,local_2a0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != paVar1) {
    operator_delete(local_208._M_dataplus._M_p,
                    CONCAT62(local_208.field_2._M_allocated_capacity._2_6_,
                             local_208.field_2._M_allocated_capacity._0_2_) + 1);
  }
LAB_001f45ad:
  if ((local_188 == 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2)) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  if (local_228[0] != local_218) {
    operator_delete(local_228[0],local_218[0] + 1);
  }
  operator_delete(puVar4,0x20);
  return __return_storage_ptr__;
}

Assistant:

static nonstd::expected<Visibility, std::string> VisibilityEnumHandler(const std::string &tok) {
  using EnumTy = std::pair<Visibility, const char *>;
  const std::vector<EnumTy> enums = {
      std::make_pair(Visibility::Inherited, "inherited"),
      std::make_pair(Visibility::Invisible, "invisible"),
  };
  return EnumHandler<Visibility>(kVisibility, tok, enums);
}